

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

double RDL_getNofRCForRCF_internal
                 (RDL_data *data,uint bcc_index,uint urf_internal_index,uint rcf_internal_index)

{
  RDL_graph *pRVar1;
  RDL_cfam **ppRVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  RDL_graph *graph;
  RDL_cfam **URF;
  double prod_limit;
  double result;
  double nofPaths2;
  double nofPaths1;
  uint rcf_internal_index_local;
  uint urf_internal_index_local;
  uint bcc_index_local;
  RDL_data *data_local;
  
  dVar3 = sqrt(1.79769313486232e+308);
  pRVar1 = data->bccGraphs->bcc_graphs[bcc_index];
  ppRVar2 = data->urfInfoPerBCC[bcc_index]->URFs[urf_internal_index];
  dVar4 = RDL_countPaths(ppRVar2[rcf_internal_index]->r,ppRVar2[rcf_internal_index]->q,pRVar1->V,
                         data->spiPerBCC[bcc_index]);
  dVar5 = RDL_countPaths(ppRVar2[rcf_internal_index]->r,ppRVar2[rcf_internal_index]->p,pRVar1->V,
                         data->spiPerBCC[bcc_index]);
  data_local = (RDL_data *)(dVar4 * dVar5);
  if ((dVar3 - 1.0 <= dVar4) || (dVar3 - 1.0 <= dVar5)) {
    (*RDL_outputFunc)(RDL_WARNING,"result overflow when counting paths!\n");
    data_local = (RDL_data *)0x7fefffffffffffff;
  }
  return (double)data_local;
}

Assistant:

static double RDL_getNofRCForRCF_internal(const RDL_data *data,
    unsigned bcc_index, unsigned urf_internal_index,
    unsigned rcf_internal_index)
{
  double nofPaths1, nofPaths2, result;
  const double prod_limit = sqrt(DBL_MAX) - 1.0;
  const RDL_cfam** URF;
  const RDL_graph* graph;

  result = 0.0;

  graph = data->bccGraphs->bcc_graphs[bcc_index];

  URF = (const RDL_cfam **)data->urfInfoPerBCC[bcc_index]->URFs[urf_internal_index];

  /* count the number of paths one both sides */
  nofPaths1 = RDL_countPaths(URF[rcf_internal_index]->r, URF[rcf_internal_index]->q,
      graph->V, data->spiPerBCC[bcc_index]);
  nofPaths2 = RDL_countPaths(URF[rcf_internal_index]->r, URF[rcf_internal_index]->p,
      graph->V, data->spiPerBCC[bcc_index]);

  result = nofPaths1 * nofPaths2;

  /* check if either of the number paths is larger than what we can multiply */
  if (nofPaths1 >= prod_limit || nofPaths2 >= prod_limit) {
    RDL_outputFunc(RDL_WARNING, "result overflow when counting paths!\n");
    return RDL_INVALID_RC_COUNT;
  }

  return result;
}